

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O0

void __thiscall World::DisplayWorld(World *this)

{
  reference this_00;
  reference pvVar1;
  size_type sVar2;
  reference pvVar3;
  ostream *poVar4;
  int local_88;
  int k;
  Tiles local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  int local_50;
  int local_4c;
  int j;
  int i;
  string temp;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  displayStack;
  World *this_local;
  
  displayStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28);
  std::__cxx11::string::string((string *)&j);
  for (local_4c = 0; local_4c < this->worldHeight; local_4c = local_4c + 1) {
    std::__cxx11::string::clear();
    for (local_50 = 0; local_50 < this->worldWidth; local_50 = local_50 + 1) {
      this_00 = std::
                vector<std::vector<Tiles,_std::allocator<Tiles>_>,_std::allocator<std::vector<Tiles,_std::allocator<Tiles>_>_>_>
                ::at(&this->world,(long)local_4c);
      pvVar1 = std::vector<Tiles,_std::allocator<Tiles>_>::at(this_00,(long)local_50);
      local_74.data = pvVar1->data;
      TileToCharacter(this,&local_74);
      std::operator+(local_70,(char)&j);
      std::__cxx11::string::operator=((string *)&j,(string *)local_70);
      std::__cxx11::string::~string((string *)local_70);
      Tiles::~Tiles(&local_74);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_28,(value_type *)&j);
  }
  local_88 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_28);
    if (sVar2 <= (ulong)(long)local_88) break;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_28,(long)local_88);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)pvVar3);
    std::operator<<(poVar4,"\n");
    local_88 = local_88 + 1;
  }
  std::__cxx11::string::~string((string *)&j);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return;
}

Assistant:

void World::DisplayWorld()
{
	vector<string> displayStack;
	string temp;

	for (int i = 0; i < worldHeight; ++i)
	{
		temp.clear();
		for (int j = 0; j < worldWidth; ++j)
		{
			temp = temp + TileToCharacter(world.at(i).at(j));
		}
		displayStack.push_back(temp);
	}

	for (int k = 0; k < displayStack.size(); ++k)
	{
		cout << displayStack.at(k) << "\n";
	}

}